

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmaxheap.c
# Opt level: O1

void swap_pointer(zmaxheap_t *heap,int a,int b)

{
  float fVar1;
  float *pfVar2;
  char *pcVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  
  pfVar2 = heap->values;
  lVar5 = (long)a;
  fVar1 = pfVar2[lVar5];
  lVar6 = (long)b;
  pfVar2[lVar5] = pfVar2[lVar6];
  pfVar2[lVar6] = fVar1;
  pcVar3 = heap->data;
  uVar4 = *(undefined8 *)(pcVar3 + lVar5 * 8);
  *(undefined8 *)(pcVar3 + lVar5 * 8) = *(undefined8 *)(pcVar3 + lVar6 * 8);
  *(undefined8 *)(pcVar3 + lVar6 * 8) = uVar4;
  return;
}

Assistant:

static inline void swap_pointer(zmaxheap_t *heap, int a, int b)
{
    float t = heap->values[a];
    heap->values[a] = heap->values[b];
    heap->values[b] = t;

    void **pp = (void**) heap->data;
    void *tmp = pp[a];
    pp[a] = pp[b];
    pp[b] = tmp;
}